

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O0

PolynomialFDS * readPDS(string *filename)

{
  byte bVar1;
  runtime_error *this;
  PolynomialFDS *pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  istream local_218 [8];
  ifstream ifil;
  string *filename_local;
  
  std::ifstream::ifstream(local_218,filename,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_248,"failed to open file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename);
    std::runtime_error::runtime_error(this,(string *)&local_248);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pPVar2 = readPDS(local_218);
  std::ifstream::~ifstream(local_218);
  return pPVar2;
}

Assistant:

PolynomialFDS* readPDS(const std::string filename) {

  // Step1: read in the file as a list of lines.
  std::ifstream ifil(filename);
  if (not ifil.is_open())
    throw std::runtime_error("failed to open file: " + filename);

  return readPDS(ifil); // RAII closes file
}